

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::ArenaTest_SpaceReuseForArraysSizeChecks_Test::TestBody
          (ArenaTest_SpaceReuseForArraysSizeChecks_Test *this)

{
  pointer ppvVar1;
  vector<void_*,_std::allocator<void_*>_> *container;
  UnorderedElementsAreArrayMatcher<void_*> *matcher;
  char *message;
  size_t num_elements;
  int iVar2;
  pointer ppvVar3;
  bool bVar4;
  ScopedTrace gtest_trace_1817;
  int local_180;
  allocator_type local_179;
  vector<void_*,_std::allocator<void_*>_> pointers;
  AssertionResult gtest_ar;
  _Vector_base<void_*,_std::allocator<void_*>_> local_150;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<void_*>_>
  local_138;
  vector<void_*,_std::allocator<void_*>_> second_pointers;
  UnorderedElementsAreArrayMatcher<void_*> local_f8;
  Arena arena;
  
  local_180 = 0;
  while( true ) {
    if (0x13 < local_180) {
      return;
    }
    testing::ScopedTrace::ScopedTrace<int>
              (&gtest_trace_1817,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x719,&local_180);
    internal::ThreadSafeArena::ThreadSafeArena(&arena.impl_);
    pointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    pointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    pointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    num_elements = (size_t)(0x10 << ((byte)local_180 & 0x1f));
    iVar2 = 10;
    while (ppvVar1 = pointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                     super__Vector_impl_data._M_finish, bVar4 = iVar2 != 0, iVar2 = iVar2 + -1,
          ppvVar3 = pointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start, bVar4) {
      local_138.matcher_._0_8_ = Arena::CreateArray<char>((Arena *)&arena.impl_,num_elements);
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&pointers,(void **)&local_138);
    }
    for (; ppvVar3 != ppvVar1; ppvVar3 = ppvVar3 + 1) {
      internal::ThreadSafeArena::ReturnArrayMemory(&arena.impl_,*ppvVar3,num_elements);
    }
    second_pointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    second_pointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    second_pointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (iVar2 = -9; iVar2 != 0; iVar2 = iVar2 + 1) {
      local_138.matcher_._0_8_ = Arena::CreateArray<char>((Arena *)&arena.impl_,num_elements);
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&second_pointers,(void **)&local_138);
    }
    std::vector<void*,std::allocator<void*>>::
    vector<__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>,void>
              ((vector<void*,std::allocator<void*>> *)&local_150,
               (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
               (pointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_start + 1),
               (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
               pointers.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_179);
    testing::UnorderedElementsAreArray<std::vector<void*,std::allocator<void*>>>
              (&local_f8,(testing *)&local_150,container);
    testing::internal::
    MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<void*>>
              (&local_138,(internal *)&local_f8,matcher);
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<void*>>::
    operator()(&gtest_ar,(char *)&local_138,
               (vector<void_*,_std::allocator<void_*>_> *)"second_pointers");
    std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
              (&local_138.matcher_.matchers_.super__Vector_base<void_*,_std::allocator<void_*>_>);
    std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
              (&local_f8.matchers_.super__Vector_base<void_*,_std::allocator<void_*>_>);
    std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base(&local_150);
    if (gtest_ar.success_ == false) break;
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
              ((_Vector_base<void_*,_std::allocator<void_*>_> *)&second_pointers);
    std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
              (&pointers.super__Vector_base<void_*,_std::allocator<void_*>_>);
    internal::ThreadSafeArena::~ThreadSafeArena(&arena.impl_);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_1817);
    local_180 = local_180 + 1;
  }
  testing::Message::Message((Message *)&local_138);
  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl ==
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    message = anon_var_dwarf_651463 + 5;
  }
  else {
    message = *(char **)gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_150,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
             ,0x730,message);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_150,(Message *)&local_138);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_150);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_138.matcher_._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_138.matcher_._0_8_ + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            (&second_pointers.super__Vector_base<void_*,_std::allocator<void_*>_>);
  std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
            (&pointers.super__Vector_base<void_*,_std::allocator<void_*>_>);
  internal::ThreadSafeArena::~ThreadSafeArena(&arena.impl_);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_1817);
  return;
}

Assistant:

TEST(ArenaTest, SpaceReuseForArraysSizeChecks) {
  // Limit to 1<<20 to avoid using too much memory on the test.
  for (int i = 0; i < 20; ++i) {
    SCOPED_TRACE(i);
    Arena arena;
    std::vector<void*> pointers;

    const size_t size = 16 << i;

    for (int j = 0; j < 10; ++j) {
      pointers.push_back(Arena::CreateArray<char>(&arena, size));
    }

    for (void* p : pointers) {
      internal::ArenaTestPeer::ReturnArrayMemory(&arena, p, size);
    }

    std::vector<void*> second_pointers;
    for (int j = 9; j != 0; --j) {
      second_pointers.push_back(Arena::CreateArray<char>(&arena, size));
    }

    // The arena will give us back the pointers we returned, except the first
    // one. That one becomes part of the freelist data structure.
    ASSERT_THAT(second_pointers,
                testing::UnorderedElementsAreArray(
                    std::vector<void*>(pointers.begin() + 1, pointers.end())));
  }
}